

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionForDecPOMDP.cpp
# Opt level: O2

string * __thiscall
QFunctionForDecPOMDP::GetCacheFilename_abi_cxx11_
          (string *__return_storage_ptr__,QFunctionForDecPOMDP *this)

{
  long *plVar1;
  PlanningUnit *pu;
  ostream *poVar2;
  long lVar3;
  double dVar4;
  stringstream ss;
  allocator<char> local_209;
  string local_208 [32];
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"GMAA",&local_209);
  pu = (PlanningUnit *)(**(code **)((long)this->super_QFunction + 0x60))(this);
  directories::MADPGetResultsDir(&local_1c8,&local_1e8,pu);
  poVar2 = std::operator<<(local_198,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2,"/");
  lVar3 = *(long *)((long)this->super_QFunction + -0x60);
  (**(code **)(*(long *)(&(this->super_QFunction).field_0x0 + lVar3) + 0x48))
            (local_208,&(this->super_QFunction).field_0x0 + lVar3);
  poVar2 = std::operator<<(poVar2,local_208);
  poVar2 = std::operator<<(poVar2,"heuristic_h");
  (**(code **)((long)this->super_QFunction + 0x60))(this);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  lVar3 = (**(code **)((long)this->super_QFunction + 0x60))(this);
  plVar1 = *(long **)(lVar3 + 0x330);
  dVar4 = (double)(**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb0)) + 0x70))
                            ((long)plVar1 + *(long *)(*plVar1 + -0xb0));
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    std::operator<<(local_198,"_g");
    lVar3 = (**(code **)((long)this->super_QFunction + 0x60))(this);
    plVar1 = *(long **)(lVar3 + 0x330);
    dVar4 = (double)(**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb0)) + 0x70))
                              ((long)plVar1 + *(long *)(*plVar1 + -0xb0));
    std::ostream::_M_insert<double>(dVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string QFunctionForDecPOMDP::GetCacheFilename() const
{
    stringstream ss;
    ss << directories::MADPGetResultsDir("GMAA",GetPU())
       << "/" << SoftPrintBrief() << "heuristic_h" << GetPU()->GetHorizon();
    if(GetPU()->GetDiscount()!=1)
        ss << "_g" << GetPU()->GetDiscount();
    return(ss.str());
}